

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void bilinear_filter8xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  long lVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  short sVar17;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar18 [16];
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  short sVar49;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  auVar8 = _DAT_00515b60;
  if (xoffset == 0) {
    if (-1 < h) {
      lVar6 = 0;
      do {
        *(undefined8 *)(dst + lVar6 * 8) = *(undefined8 *)src;
        src = src + src_stride;
        lVar6 = lVar6 + 1;
      } while (h + 1 != (int)lVar6);
    }
  }
  else if (xoffset == 4) {
    if (-1 < h) {
      lVar6 = 0;
      do {
        uVar9 = pavgb(src[1],*src);
        uVar10 = pavgb(src[2],src[1]);
        uVar11 = pavgb(src[3],src[2]);
        uVar12 = pavgb(src[4],src[3]);
        uVar13 = pavgb(src[5],src[4]);
        uVar14 = pavgb(src[6],src[5]);
        uVar15 = pavgb(src[7],src[6]);
        uVar16 = pavgb(src[8],src[7]);
        pavgb(src[9],src[8]);
        pavgb(src[10],src[9]);
        pavgb(src[0xb],src[10]);
        pavgb(src[0xc],src[0xb]);
        pavgb(src[0xd],src[0xc]);
        pavgb(src[0xe],src[0xd]);
        pavgb(src[0xf],src[0xe]);
        pavgb(0,src[0xf]);
        *(ulong *)(dst + lVar6 * 8) =
             CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar14,CONCAT14(uVar13,CONCAT13(uVar12,
                                                  CONCAT12(uVar11,CONCAT11(uVar10,uVar9)))))));
        src = src + src_stride;
        lVar6 = lVar6 + 1;
      } while (h + 1 != (int)lVar6);
    }
  }
  else {
    auVar25 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    puVar5 = dst;
    if (0 < h) {
      iVar7 = 0;
      do {
        auVar34 = pshufb(*(undefined1 (*) [16])src,auVar8);
        auVar34 = pmaddubsw(auVar34,auVar25);
        sVar17 = pavgw(auVar34._0_2_ >> 6,0);
        sVar26 = pavgw(auVar34._2_2_ >> 6,0);
        sVar27 = pavgw(auVar34._4_2_ >> 6,0);
        sVar28 = pavgw(auVar34._6_2_ >> 6,0);
        sVar29 = pavgw(auVar34._8_2_ >> 6,0);
        sVar30 = pavgw(auVar34._10_2_ >> 6,0);
        sVar31 = pavgw(auVar34._12_2_ >> 6,0);
        sVar32 = pavgw(auVar34._14_2_ >> 6,0);
        auVar34 = pshufb(*(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride),auVar8);
        auVar34 = pmaddubsw(auVar34,auVar25);
        sVar33 = pavgw(auVar34._0_2_ >> 6,0);
        sVar43 = pavgw(auVar34._2_2_ >> 6,0);
        sVar44 = pavgw(auVar34._4_2_ >> 6,0);
        sVar45 = pavgw(auVar34._6_2_ >> 6,0);
        sVar46 = pavgw(auVar34._8_2_ >> 6,0);
        sVar47 = pavgw(auVar34._10_2_ >> 6,0);
        sVar48 = pavgw(auVar34._12_2_ >> 6,0);
        sVar49 = pavgw(auVar34._14_2_ >> 6,0);
        *puVar5 = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        puVar5[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
        puVar5[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        puVar5[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar5[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar5[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar5[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar5[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar5[8] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar5[9] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        puVar5[10] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
        puVar5[0xb] = (0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45);
        puVar5[0xc] = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
        puVar5[0xd] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar5[0xe] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        puVar5[0xf] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        src = *(undefined1 (*) [16])src + src_stride * 2;
        puVar5 = puVar5 + 0x10;
        iVar7 = iVar7 + 2;
      } while (iVar7 < h);
    }
    auVar8 = pshufb(*(undefined1 (*) [16])src,_DAT_00515b60);
    auVar8 = pmaddubsw(auVar8,auVar25);
    sVar17 = pavgw(0,auVar8._0_2_ >> 6);
    sVar26 = pavgw(0,auVar8._2_2_ >> 6);
    sVar27 = pavgw(0,auVar8._4_2_ >> 6);
    sVar28 = pavgw(0,auVar8._6_2_ >> 6);
    sVar29 = pavgw(0,auVar8._8_2_ >> 6);
    sVar30 = pavgw(0,auVar8._10_2_ >> 6);
    sVar31 = pavgw(0,auVar8._12_2_ >> 6);
    sVar32 = pavgw(0,auVar8._14_2_ >> 6);
    *(ulong *)puVar5 =
         CONCAT17((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32),
                  CONCAT16((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31),
                           CONCAT15((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30)
                                    ,CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 -
                                              (0xff < sVar29),
                                              CONCAT13((0 < sVar28) * (sVar28 < 0x100) *
                                                       (char)sVar28 - (0xff < sVar28),
                                                       CONCAT12((0 < sVar27) * (sVar27 < 0x100) *
                                                                (char)sVar27 - (0xff < sVar27),
                                                                CONCAT11((0 < sVar26) *
                                                                         (sVar26 < 0x100) *
                                                                         (char)sVar26 -
                                                                         (0xff < sVar26),
                                                                         (0 < sVar17) *
                                                                         (sVar17 < 0x100) *
                                                                         (char)sVar17 -
                                                                         (0xff < sVar17))))))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      if (0 < h) {
        lVar6 = 0;
        do {
          uVar1 = *(undefined8 *)(dst + lVar6 * 8);
          uVar2 = *(undefined8 *)(dst + lVar6 * 8 + 8);
          uVar9 = pavgb((char)uVar2,(char)uVar1);
          uVar10 = pavgb((char)((ulong)uVar2 >> 8),(char)((ulong)uVar1 >> 8));
          uVar11 = pavgb((char)((ulong)uVar2 >> 0x10),(char)((ulong)uVar1 >> 0x10));
          uVar12 = pavgb((char)((ulong)uVar2 >> 0x18),(char)((ulong)uVar1 >> 0x18));
          uVar13 = pavgb((char)((ulong)uVar2 >> 0x20),(char)((ulong)uVar1 >> 0x20));
          uVar14 = pavgb((char)((ulong)uVar2 >> 0x28),(char)((ulong)uVar1 >> 0x28));
          uVar15 = pavgb((char)((ulong)uVar2 >> 0x30),(char)((ulong)uVar1 >> 0x30));
          uVar16 = pavgb((char)((ulong)uVar2 >> 0x38),(char)((ulong)uVar1 >> 0x38));
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          pavgb(0,0);
          *(ulong *)(dst + lVar6 * 8) =
               CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar14,CONCAT14(uVar13,CONCAT13(uVar12,
                                                  CONCAT12(uVar11,CONCAT11(uVar10,uVar9)))))));
          lVar6 = lVar6 + 1;
        } while (h != (int)lVar6);
      }
    }
    else if (0 < h) {
      auVar8 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                       ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar8._4_4_ = auVar8._0_4_;
      auVar8._8_4_ = auVar8._0_4_;
      auVar8._12_4_ = auVar8._0_4_;
      lVar6 = 0;
      do {
        uVar3 = *(ulong *)(dst + lVar6 * 8);
        uVar4 = *(ulong *)(dst + lVar6 * 8 + 8);
        uVar1 = *(undefined8 *)(dst + lVar6 * 8 + 0x10);
        uVar15 = (undefined1)(uVar4 >> 0x38);
        auVar24._8_6_ = 0;
        auVar24._0_8_ = uVar3;
        auVar24[0xe] = (char)(uVar3 >> 0x38);
        auVar24[0xf] = uVar15;
        auVar23._14_2_ = auVar24._14_2_;
        auVar23._8_5_ = 0;
        auVar23._0_8_ = uVar3;
        uVar14 = (undefined1)(uVar4 >> 0x30);
        auVar23[0xd] = uVar14;
        auVar22._13_3_ = auVar23._13_3_;
        auVar22._8_4_ = 0;
        auVar22._0_8_ = uVar3;
        auVar22[0xc] = (char)(uVar3 >> 0x30);
        auVar21._12_4_ = auVar22._12_4_;
        auVar21._8_3_ = 0;
        auVar21._0_8_ = uVar3;
        uVar13 = (undefined1)(uVar4 >> 0x28);
        auVar21[0xb] = uVar13;
        auVar20._11_5_ = auVar21._11_5_;
        auVar20._8_2_ = 0;
        auVar20._0_8_ = uVar3;
        auVar20[10] = (char)(uVar3 >> 0x28);
        auVar19._10_6_ = auVar20._10_6_;
        auVar19[8] = 0;
        auVar19._0_8_ = uVar3;
        uVar12 = (undefined1)(uVar4 >> 0x20);
        auVar19[9] = uVar12;
        auVar34._9_7_ = auVar19._9_7_;
        auVar34[8] = (char)(uVar3 >> 0x20);
        auVar34._0_8_ = uVar3;
        auVar18._8_8_ = auVar34._8_8_;
        uVar11 = (undefined1)(uVar4 >> 0x18);
        auVar18[7] = uVar11;
        auVar18[6] = (char)(uVar3 >> 0x18);
        uVar10 = (undefined1)(uVar4 >> 0x10);
        auVar18[5] = uVar10;
        auVar18[4] = (char)(uVar3 >> 0x10);
        uVar9 = (undefined1)(uVar4 >> 8);
        auVar18[3] = uVar9;
        auVar18[2] = (char)(uVar3 >> 8);
        auVar18[0] = (undefined1)uVar3;
        auVar35[0] = (undefined1)uVar4;
        auVar18[1] = auVar35[0];
        auVar25 = pmaddubsw(auVar18,auVar8);
        sVar17 = pavgw(auVar25._0_2_ >> 6,0);
        sVar26 = pavgw(auVar25._2_2_ >> 6,0);
        sVar27 = pavgw(auVar25._4_2_ >> 6,0);
        sVar28 = pavgw(auVar25._6_2_ >> 6,0);
        sVar29 = pavgw(auVar25._8_2_ >> 6,0);
        sVar30 = pavgw(auVar25._10_2_ >> 6,0);
        sVar31 = pavgw(auVar25._12_2_ >> 6,0);
        sVar32 = pavgw(auVar25._14_2_ >> 6,0);
        auVar42._8_6_ = 0;
        auVar42._0_8_ = uVar4;
        auVar42[0xe] = uVar15;
        auVar42[0xf] = (char)((ulong)uVar1 >> 0x38);
        auVar41._14_2_ = auVar42._14_2_;
        auVar41._8_5_ = 0;
        auVar41._0_8_ = uVar4;
        auVar41[0xd] = (char)((ulong)uVar1 >> 0x30);
        auVar40._13_3_ = auVar41._13_3_;
        auVar40._8_4_ = 0;
        auVar40._0_8_ = uVar4;
        auVar40[0xc] = uVar14;
        auVar39._12_4_ = auVar40._12_4_;
        auVar39._8_3_ = 0;
        auVar39._0_8_ = uVar4;
        auVar39[0xb] = (char)((ulong)uVar1 >> 0x28);
        auVar38._11_5_ = auVar39._11_5_;
        auVar38._8_2_ = 0;
        auVar38._0_8_ = uVar4;
        auVar38[10] = uVar13;
        auVar37._10_6_ = auVar38._10_6_;
        auVar37[8] = 0;
        auVar37._0_8_ = uVar4;
        auVar37[9] = (char)((ulong)uVar1 >> 0x20);
        auVar36._9_7_ = auVar37._9_7_;
        auVar36[8] = uVar12;
        auVar36._0_8_ = uVar4;
        auVar35._8_8_ = auVar36._8_8_;
        auVar35[7] = (char)((ulong)uVar1 >> 0x18);
        auVar35[6] = uVar11;
        auVar35[5] = (char)((ulong)uVar1 >> 0x10);
        auVar35[4] = uVar10;
        auVar35[3] = (char)((ulong)uVar1 >> 8);
        auVar35[2] = uVar9;
        auVar35[1] = (char)uVar1;
        auVar25 = pmaddubsw(auVar35,auVar8);
        sVar33 = pavgw(auVar25._0_2_ >> 6,0);
        sVar43 = pavgw(auVar25._2_2_ >> 6,0);
        sVar44 = pavgw(auVar25._4_2_ >> 6,0);
        sVar45 = pavgw(auVar25._6_2_ >> 6,0);
        sVar46 = pavgw(auVar25._8_2_ >> 6,0);
        sVar47 = pavgw(auVar25._10_2_ >> 6,0);
        sVar48 = pavgw(auVar25._12_2_ >> 6,0);
        sVar49 = pavgw(auVar25._14_2_ >> 6,0);
        puVar5 = dst + lVar6 * 8;
        *puVar5 = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
        puVar5[1] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
        puVar5[2] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        puVar5[3] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar5[4] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar5[5] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar5[6] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar5[7] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar5[8] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar5[9] = (0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43);
        puVar5[10] = (0 < sVar44) * (sVar44 < 0x100) * (char)sVar44 - (0xff < sVar44);
        puVar5[0xb] = (0 < sVar45) * (sVar45 < 0x100) * (char)sVar45 - (0xff < sVar45);
        puVar5[0xc] = (0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46);
        puVar5[0xd] = (0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47);
        puVar5[0xe] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        puVar5[0xf] = (0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49);
        lVar6 = lVar6 + 2;
      } while ((int)lVar6 < h);
    }
  }
  return;
}

Assistant:

static void bilinear_filter8xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      _mm_storel_epi64((__m128i *)b, x);
      src += src_stride;
      b += 8;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadu_si128((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      _mm_storel_epi64((__m128i *)b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 8;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x0 = _mm_loadu_si128((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadu_si128((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i res = filter_block_2rows(&x0, &z0, &x1, &z1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 2;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x0 = _mm_loadu_si128((__m128i *)src);
    const __m128i z0 = _mm_srli_si128(x0, 1);

    __m128i v0 = _mm_unpacklo_epi8(x0, z0);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    _mm_storel_epi64((__m128i *)b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)dst);
      __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      _mm_storel_epi64((__m128i *)dst, _mm_avg_epu8(x, y));
      dst += 8;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 2) {
      const __m128i x = _mm_loadl_epi64((__m128i *)dst);
      const __m128i y = _mm_loadl_epi64((__m128i *)&dst[8]);
      const __m128i z = _mm_loadl_epi64((__m128i *)&dst[16]);
      const __m128i res = filter_block_2rows(&x, &y, &y, &z, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}